

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O3

REF_STATUS ref_gather_plt_tet_header(REF_GRID ref_grid,FILE *file)

{
  REF_MPI pRVar1;
  uint uVar2;
  size_t sVar3;
  undefined8 uVar4;
  char *pcVar5;
  undefined8 uVar6;
  int celldim;
  int aux;
  int numelements;
  int numpts;
  int faceneighbors;
  int varloc;
  int datapacking;
  int zonetype;
  int notused;
  int strandid;
  int parentzone;
  float zonemarker;
  REF_GLOB *l2c;
  REF_GLOB nnode;
  REF_LONG ncell;
  double solutiontime;
  int ascii [8];
  undefined4 local_88;
  undefined4 local_84;
  undefined4 local_80;
  undefined4 local_7c;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_6c;
  undefined4 local_68;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_5c;
  REF_GLOB *local_58;
  ulong local_50;
  ulong local_48 [3];
  undefined4 local_30;
  
  pRVar1 = ref_grid->mpi;
  local_5c = 0x43958000;
  local_60 = 0xffffffff;
  local_64 = 0xffffffff;
  local_48[1] = 0;
  local_68 = 0xffffffff;
  local_70 = 0;
  local_74 = 0;
  local_78 = 0;
  local_88 = 0;
  local_84 = 0;
  local_6c = 4;
  uVar2 = ref_grid_compact_cell_nodes
                    (ref_grid,ref_grid->cell[8],(REF_GLOB *)&local_50,(REF_LONG *)local_48,&local_58
                    );
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0xebe,
           "ref_gather_plt_tet_header",(ulong)uVar2,"l2c");
    return uVar2;
  }
  if (0 < (long)local_48[0] && 0 < (long)local_50) {
    if (local_50 >> 0x1f == 0) {
      local_7c = (undefined4)local_50;
      if (local_48[0] < 0x80000000) {
        local_80 = (undefined4)local_48[0];
        if (pRVar1->id == 0) {
          sVar3 = fwrite(&local_5c,4,1,(FILE *)file);
          if (sVar3 == 1) {
            local_48[2] = 0x3400000065;
            local_30 = 0;
            sVar3 = fwrite(local_48 + 2,4,3,(FILE *)file);
            if (sVar3 == 3) {
              sVar3 = fwrite(&local_60,4,1,(FILE *)file);
              if (sVar3 == 1) {
                sVar3 = fwrite(&local_64,4,1,(FILE *)file);
                if (sVar3 == 1) {
                  sVar3 = fwrite(local_48 + 1,8,1,(FILE *)file);
                  if (sVar3 == 1) {
                    sVar3 = fwrite(&local_68,4,1,(FILE *)file);
                    if (sVar3 == 1) {
                      sVar3 = fwrite(&local_6c,4,1,(FILE *)file);
                      if (sVar3 == 1) {
                        sVar3 = fwrite(&local_70,4,1,(FILE *)file);
                        if (sVar3 == 1) {
                          sVar3 = fwrite(&local_74,4,1,(FILE *)file);
                          if (sVar3 == 1) {
                            sVar3 = fwrite(&local_78,4,1,(FILE *)file);
                            if (sVar3 == 1) {
                              sVar3 = fwrite(&local_7c,4,1,(FILE *)file);
                              if (sVar3 == 1) {
                                sVar3 = fwrite(&local_80,4,1,(FILE *)file);
                                if (sVar3 == 1) {
                                  sVar3 = fwrite(&local_88,4,1,(FILE *)file);
                                  if (sVar3 == 1) {
                                    sVar3 = fwrite(&local_88,4,1,(FILE *)file);
                                    if (sVar3 == 1) {
                                      sVar3 = fwrite(&local_88,4,1,(FILE *)file);
                                      if (sVar3 == 1) {
                                        sVar3 = fwrite(&local_84,4,1,(FILE *)file);
                                        if (sVar3 == 1) goto LAB_0018000b;
                                        pcVar5 = "int";
                                        uVar6 = 1;
                                        uVar4 = 0xede;
                                      }
                                      else {
                                        pcVar5 = "int";
                                        uVar6 = 1;
                                        uVar4 = 0xedd;
                                      }
                                    }
                                    else {
                                      pcVar5 = "int";
                                      uVar6 = 1;
                                      uVar4 = 0xedc;
                                    }
                                  }
                                  else {
                                    pcVar5 = "int";
                                    uVar6 = 1;
                                    uVar4 = 0xedb;
                                  }
                                }
                                else {
                                  pcVar5 = "int";
                                  uVar6 = 1;
                                  uVar4 = 0xeda;
                                }
                              }
                              else {
                                pcVar5 = "int";
                                uVar6 = 1;
                                uVar4 = 0xed9;
                              }
                            }
                            else {
                              pcVar5 = "int";
                              uVar6 = 1;
                              uVar4 = 0xed8;
                            }
                          }
                          else {
                            pcVar5 = "int";
                            uVar6 = 1;
                            uVar4 = 0xed7;
                          }
                        }
                        else {
                          pcVar5 = "int";
                          uVar6 = 1;
                          uVar4 = 0xed6;
                        }
                      }
                      else {
                        pcVar5 = "int";
                        uVar6 = 1;
                        uVar4 = 0xed5;
                      }
                    }
                    else {
                      pcVar5 = "int";
                      uVar6 = 1;
                      uVar4 = 0xed4;
                    }
                  }
                  else {
                    pcVar5 = "double";
                    uVar6 = 1;
                    uVar4 = 0xed3;
                  }
                }
                else {
                  pcVar5 = "int";
                  uVar6 = 1;
                  uVar4 = 0xed2;
                }
              }
              else {
                pcVar5 = "int";
                uVar6 = 1;
                uVar4 = 0xed1;
              }
            }
            else {
              pcVar5 = "title";
              uVar6 = 3;
              uVar4 = 0xecf;
            }
          }
          else {
            pcVar5 = "zonemarker";
            uVar6 = 1;
            uVar4 = 0xeca;
          }
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 uVar4,"ref_gather_plt_tet_header",pcVar5,uVar6,sVar3);
          return 1;
        }
        goto LAB_0018000b;
      }
      pcVar5 = "too many tets for int";
      uVar4 = 0xec6;
    }
    else {
      pcVar5 = "too many nodes for int";
      uVar4 = 0xec4;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar4,
           "ref_gather_plt_tet_header",pcVar5);
    return 1;
  }
LAB_0018000b:
  if (local_58 != (REF_GLOB *)0x0) {
    free(local_58);
    return 0;
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_plt_tet_header(REF_GRID ref_grid,
                                                    FILE *file) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  int ascii[8];
  float zonemarker = 299.0;
  int parentzone = -1;
  int strandid = -1;
  double solutiontime = 0.0;
  int notused = -1;
  int zonetype;
  int datapacking = 0; /*0=Block, point does not work.*/
  int varloc = 0;      /*0 = Don't specify, all data is located at nodes*/
  int faceneighbors = 0;
  int numpts;
  int numelements;
  REF_LONG ncell;
  REF_GLOB nnode, *l2c;
  int celldim = 0;
  int aux = 0;

  zonetype = 4; /*4=FETETRAHEDRON*/

  RSS(ref_grid_compact_cell_nodes(ref_grid, ref_cell, &nnode, &ncell, &l2c),
      "l2c");
  if (nnode <= 0 || ncell <= 0) {
    ref_free(l2c);
    return REF_SUCCESS;
  }

  RAS(nnode <= REF_INT_MAX, "too many nodes for int");
  numpts = (int)nnode;
  RAS(ncell <= REF_INT_MAX, "too many tets for int");
  numelements = (int)ncell;

  if (ref_mpi_once(ref_mpi)) {
    REIS(1, fwrite(&zonemarker, sizeof(float), 1, file), "zonemarker");

    ascii[0] = (int)'e';
    ascii[1] = (int)'4';
    ascii[2] = 0;
    REIS(3, fwrite(&ascii, sizeof(int), 3, file), "title");

    REIS(1, fwrite(&parentzone, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&strandid, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&solutiontime, sizeof(double), 1, file), "double");
    REIS(1, fwrite(&notused, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&zonetype, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&datapacking, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&varloc, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&faceneighbors, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&numpts, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&numelements, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&celldim, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&celldim, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&celldim, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&aux, sizeof(int), 1, file), "int");
  }

  ref_free(l2c);
  return REF_SUCCESS;
}